

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.h
# Opt level: O0

void __thiscall pmx::PmxMaterial::~PmxMaterial(PmxMaterial *this)

{
  PmxMaterial *this_local;
  
  std::__cxx11::string::~string((string *)&this->memo);
  std::__cxx11::string::~string((string *)&this->material_english_name);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

PmxMaterial()
			: specularlity(0.0f)
			, flag(0)
			, edge_size(0.0f)
			, diffuse_texture_index(0)
			, sphere_texture_index(0)
			, sphere_op_mode(0)
			, common_toon_flag(0)
			, toon_texture_index(0)
			, index_count(0)
		{
			for (int i = 0; i < 3; ++i) {
				specular[i] = 0.0f;
				ambient[i] = 0.0f;
				edge_color[i] = 0.0f;
			}
			for (int i = 0; i < 4; ++i) {
				diffuse[i] = 0.0f;
			}
		}